

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::MultDivideMod(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  string local_50;
  
  requireDStackDepth(this,3,"*/MOD");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  if (uVar1 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"*/: zero divisor","");
    throwCppExceptionMessage(this,&local_50,errorDivisionByZero);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::setTop
            (this_00,1,(uint)(((long)(int)uVar3 * (long)(int)uVar2) % (long)(int)uVar1));
  ForthStack<unsigned_int>::setTop
            (this_00,0,(uint)(((long)(int)uVar3 * (long)(int)uVar2) / (long)(int)uVar1));
  return;
}

Assistant:

void MultDivideMod(){
			REQUIRE_DSTACK_DEPTH(3, "*/MOD");
			SDCell n3(static_cast<SCell>(dStack.getTop())); dStack.pop();
			SDCell n2(static_cast<SCell>(dStack.getTop())); 
			RUNTIME_ERROR_IF(n3.data_.Cells.lo == 0, "*/: zero divisor", errorDivisionByZero);
			SDCell n1(static_cast<SCell>( dStack.getTop(1)));
			SDCell quotent( (n1.data_.Dcells*n2.data_.Dcells) / n3.data_.Dcells );
			SDCell reminder( (n1.data_.Dcells*n2.data_.Dcells) % n3.data_.Dcells );
			dStack.setTop(1, reminder.data_.Cells.lo);
			dStack.setTop(0, quotent.data_.Cells.lo);
		}